

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O2

void choose_artifact_theme(artifact *art)

{
  bool bVar1;
  bool bVar2;
  int16_t iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  object_kind *poVar7;
  activation *paVar8;
  wchar_t wVar9;
  char *pcVar10;
  char *pcVar11;
  _Bool _Var12;
  int iVar13;
  bool bVar14;
  
  poVar7 = lookup_kind(art->tval,art->sval);
  wVar9 = potential;
  if ((L'ᝰ' < potential) && (uVar4 = Rand_div(30000), uVar4 + L'\x01' < wVar9)) {
    for (iVar13 = -3; iVar13 != 0; iVar13 = iVar13 + 1) {
      uVar4 = Rand_div(z_info->curse_max - 1);
      uVar5 = Rand_div(9);
      iVar3 = m_bonus(9,art->alloc_min);
      if (curses[uVar4 + L'\x01'].poss[art->tval] == true) {
        append_artifact_curse(art,uVar4 + L'\x01',uVar5 + iVar3 * 10 + L'\x01');
      }
    }
  }
  switch(poVar7->tval) {
  case L'\x05':
    uVar4 = Rand_div(100);
    uVar5 = Rand_div(9);
    art->to_d = (short)(potential / 0x28a) + (short)uVar5 + art->to_d + 4;
    uVar5 = Rand_div(9);
    wVar9 = potential;
    art->to_h = (short)(potential / 0x28a) + (short)uVar5 + art->to_h + 4;
    if ((int)uVar4 < 0x32) {
      get_property(art,(object *)0x0,"shooting speed",L'\x01',true);
      if ((L'ߏ' < potential) && (uVar4 = Rand_div(3), uVar4 == 0)) {
        pcVar10 = "shooting power";
LAB_00188880:
        get_property(art,(object *)0x0,pcVar10,L'\x01',false);
      }
    }
    else {
      if (wVar9 < L'ྠ') {
LAB_00188847:
        wVar9 = L'\x01';
      }
      else {
        wVar9 = L'\x02';
        uVar4 = Rand_div(2);
        if (uVar4 != 0) goto LAB_00188847;
      }
      get_property(art,(object *)0x0,"shooting power",wVar9,true);
      if ((L'ࣉ' < potential) && (uVar4 = Rand_div(3), uVar4 == 0)) {
        pcVar10 = "shooting speed";
        goto LAB_00188880;
      }
    }
    wVar9 = potential;
    uVar4 = Rand_div(5000);
    if ((uVar4 + L'\x01' < wVar9) && (uVar4 = Rand_div(3), uVar4 != 0)) {
      uVar4 = Rand_div(2);
      pcVar10 = "RAND_BRAND_MISSILE";
      if (uVar4 == 0) {
        pcVar10 = "RAND_SUPER_SHOOTING";
      }
      paVar8 = lookup_activation(pcVar10);
      art->activation = paVar8;
    }
    if (potential < L'Ϩ') {
      potential = L'Ϩ';
    }
    break;
  default:
    msg("error -- object kind not recognized.");
    break;
  case L'\a':
  case L'\b':
  case L'\t':
    choose_melee_weapon_theme(art);
    break;
  case L'\n':
    uVar4 = Rand_div(100);
    uVar5 = Rand_div(5);
    wVar9 = potential;
    art->to_a = (short)((long)potential / 0x5dc) + (short)uVar5 + art->to_a + 7;
    if ((int)uVar4 < 0x19) {
      if (L'ᆓ' < wVar9) {
        iVar13 = damroll(3,2);
        wVar9 = iVar13 + L'\x05';
        pcVar10 = "speed";
        _Var12 = true;
LAB_001898cd:
        get_property(art,(object *)0x0,pcVar10,wVar9,_Var12);
      }
    }
    else if (uVar4 < 0x23) {
      uVar4 = Rand_div(5);
      get_property(art,(object *)0x0,"nexus resistance",uVar4 * 5 + L'#',true);
      get_property(art,(object *)0x0,"feather falling",L'\0',true);
      uVar4 = Rand_div(5);
      if (uVar4 == 0) {
        wVar9 = lookup_curse("anti-teleportation");
        uVar4 = Rand_div(0x14);
        append_artifact_curse(art,wVar9,uVar4 + L'(');
        potential = potential + L'Ĭ';
      }
    }
    else {
      if (0x31 < uVar4) {
        if (uVar4 < 0x3c) {
          uVar4 = Rand_div(2);
          if (uVar4 == 0) {
            pcVar10 = "RAND_HEAL1";
            if (L'ஷ' < potential) {
              pcVar10 = "RAND_HEAL2";
            }
            pcVar11 = "RAND_HEAL3";
            if (potential < L'ᕼ') {
              pcVar11 = pcVar10;
            }
            paVar8 = lookup_activation(pcVar11);
            art->activation = paVar8;
          }
          get_property(art,(object *)0x0,"regeneration",L'\0',true);
          uVar4 = Rand_div(4);
          get_property(art,(object *)0x0,"extra moves",(uint)(uVar4 == 0) + L'\x01',true);
          uVar4 = Rand_div(4);
          wVar9 = uVar4 + L'\x01';
          pcVar10 = "constitution";
        }
        else if (uVar4 < 0x46) {
          uVar4 = Rand_div(3);
          if ((uVar4 != 0) && (L'ৃ' < potential)) {
            paVar8 = lookup_activation("RAND_STORM_DANCE");
            art->activation = paVar8;
          }
          get_property(art,(object *)0x0,"feather falling",L'\0',true);
          uVar4 = Rand_div(4);
          wVar9 = uVar4 + L'\x01';
          pcVar10 = "dexterity";
        }
        else {
          if (0x4f < uVar4) goto LAB_001898d2;
          uVar4 = Rand_div(3);
          if (uVar4 != 0) {
            paVar8 = lookup_activation("RAND_DETECT_MONSTERS");
            art->activation = paVar8;
          }
          get_property(art,(object *)0x0,"regeneration",L'\0',true);
          get_property(art,(object *)0x0,"slow digestion",L'\0',true);
          uVar4 = Rand_div(6);
          if (uVar4 == 0) {
            get_property(art,(object *)0x0,"telepathy",L'\0',false);
          }
          uVar4 = Rand_div(4);
          wVar9 = uVar4 + L'\x01';
          pcVar10 = "stealth";
        }
        _Var12 = false;
        goto LAB_001898cd;
      }
      pcVar10 = "RAND_TELEPORT1";
      if (L'ߏ' < wVar9) {
        pcVar10 = "RAND_TELEPORT2";
      }
      pcVar11 = "RAND_RECALL";
      if (wVar9 < L'ྠ') {
        pcVar11 = pcVar10;
      }
      paVar8 = lookup_activation(pcVar11);
      art->activation = paVar8;
      potential = (potential * 2) / 3;
      uVar4 = Rand_div(5);
      get_property(art,(object *)0x0,"nexus resistance",uVar4 * 5 + L'#',true);
      get_property(art,(object *)0x0,"trap immunity",L'\0',true);
      if (L'ϧ' < potential) {
        uVar4 = Rand_div(4);
        get_property(art,(object *)0x0,"dexterity",uVar4 + L'\x01',false);
      }
      uVar4 = Rand_div(5);
      if (uVar4 == 0) {
        wVar9 = lookup_curse("teleportation");
        uVar4 = Rand_div(0x14);
        append_artifact_curse(art,wVar9,uVar4 + L'(');
        potential = potential + L'd';
      }
    }
LAB_001898d2:
    uVar4 = Rand_div(4);
    if (((uVar4 != 0) || (art->activation != (activation *)0x0)) || (potential < L'ߐ')) break;
    pcVar10 = "RAND_SPEED";
LAB_00189908:
    paVar8 = lookup_activation(pcVar10);
    art->activation = paVar8;
    break;
  case L'\v':
    uVar4 = Rand_div(100);
    uVar5 = Rand_div(5);
    wVar9 = potential;
    art->to_a = (short)(potential / 0x5dc) + (short)uVar5 + art->to_a + 8;
    if ((int)uVar4 < 0x1e) {
      uVar4 = Rand_div(4);
      get_property(art,(object *)0x0,"skill bonus",uVar4 + L'\a',true);
      get_property(art,(object *)0x0,"deadliness bonus",uVar4 + L'\a',true);
      uVar4 = Rand_div(3);
      if (uVar4 != 0) {
        get_property(art,(object *)0x0,"free action",L'\0',true);
      }
      uVar4 = Rand_div(6);
      if (uVar4 != 0) break;
      uVar4 = Rand_div(3);
      wVar9 = ~uVar4;
      pcVar10 = "stealth";
      _Var12 = true;
      goto LAB_00189354;
    }
    if (uVar4 < 0x2d) {
      get_property(art,(object *)0x0,"protection from fear",L'\0',true);
      uVar4 = Rand_div(3);
      if (uVar4 != 0) {
        get_property(art,(object *)0x0,"regeneration",L'\0',false);
      }
      uVar4 = Rand_div(2);
      if (uVar4 == 0) {
        get_property(art,(object *)0x0,"free action",L'\0',false);
      }
      uVar4 = Rand_div(3);
      if (uVar4 == 0) {
        uVar4 = Rand_div(4);
        pcVar10 = "strength";
      }
      else {
        uVar5 = Rand_div(2);
        uVar4 = Rand_div(4);
        if (uVar5 == 0) {
          pcVar10 = "dexterity";
        }
        else {
          pcVar10 = "constitution";
        }
      }
      get_property(art,(object *)0x0,pcVar10,uVar4 + L'\x01',false);
      if ((L'כ' < potential) && (uVar4 = Rand_div(4), uVar4 != 0)) {
        uVar4 = Rand_div(4);
        get_property(art,(object *)0x0,"deadliness bonus",uVar4 + L'\x05',false);
        get_property(art,(object *)0x0,"skill bonus",uVar4 + L'\x05',false);
      }
      uVar4 = Rand_div(6);
      if (uVar4 != 0) break;
      uVar4 = Rand_div(6);
      wVar9 = uVar4 * -5 + L'\xfffffffb';
      goto LAB_00188182;
    }
    if (uVar4 < 0x3c) {
      uVar4 = Rand_div(4);
      get_property(art,(object *)0x0,"armor bonus",uVar4 + L'\x05',false);
      iVar13 = 2;
      while (bVar14 = iVar13 != 0, iVar13 = iVar13 + -1, bVar14) {
        uVar4 = Rand_div(4);
        if (uVar4 == 0) {
          bVar2 = false;
          pcVar10 = "fire resistance";
          bVar14 = false;
LAB_00188d6b:
          bVar1 = false;
LAB_00188d6d:
          uVar5 = Rand_div(5);
          get_property(art,(object *)0x0,pcVar10,uVar5 * 5 + L'#',true);
        }
        else {
          if (uVar4 == 1) {
            bVar2 = false;
            bVar14 = true;
            pcVar10 = "cold resistance";
            goto LAB_00188d6b;
          }
          if (uVar4 == 3) {
            bVar2 = true;
            bVar14 = false;
            pcVar10 = "electricity resistance";
            goto LAB_00188d6b;
          }
          bVar2 = false;
          bVar14 = false;
          bVar1 = false;
          if (uVar4 == 2) {
            bVar1 = true;
            bVar2 = false;
            pcVar10 = "acid resistance";
            bVar14 = false;
            goto LAB_00188d6d;
          }
        }
        if ((L'ǳ' < potential) && (uVar5 = Rand_div(3), uVar5 != 0)) {
          if (uVar4 == 0) {
            paVar8 = lookup_activation("RAND_FIRE1");
            art->activation = paVar8;
          }
          if (bVar14) {
            paVar8 = lookup_activation("RAND_COLD1");
            art->activation = paVar8;
          }
          if (bVar1) {
            paVar8 = lookup_activation("RAND_ACID1");
            art->activation = paVar8;
          }
          if (bVar2) {
            paVar8 = lookup_activation("RAND_ELEC1");
            art->activation = paVar8;
          }
        }
      }
      break;
    }
    if (uVar4 < 0x4b) {
      paVar8 = lookup_activation("RAND_DISARM");
      art->activation = paVar8;
      uVar4 = Rand_div(4);
      get_property(art,(object *)0x0,"stealth",uVar4 + L'\x01',false);
      uVar4 = Rand_div(4);
      get_property(art,(object *)0x0,"searching skill",uVar4 + L'\x01',false);
      uVar4 = Rand_div(3);
      if (uVar4 != 0) {
        get_property(art,(object *)0x0,"free action",L'\0',false);
      }
      uVar4 = Rand_div(5);
      if (uVar4 != 0) break;
      uVar4 = Rand_div(6);
      wVar9 = uVar4 * -5 + L'\xfffffffb';
      goto LAB_00188507;
    }
    if (uVar4 < 0x5a) {
      uVar4 = Rand_div(4);
      get_property(art,(object *)0x0,"magic mastery",uVar4 + L'\x01',false);
      pcVar10 = "trap immunity";
    }
    else {
      if (L'ණ' < wVar9 || 99 < uVar4) break;
      paVar8 = lookup_activation("RAND_SUPER_SHOOTING");
      art->activation = paVar8;
      potential = potential + L'\xfffffd12';
      uVar4 = Rand_div(5);
      get_property(art,(object *)0x0,"deadliness bonus",uVar4 + L'\x06',false);
      get_property(art,(object *)0x0,"skill bonus",uVar4 + L'\x06',false);
      uVar4 = Rand_div(3);
      if (uVar4 == 0) break;
      pcVar10 = "free action";
    }
LAB_001881e4:
    wVar9 = L'\0';
    goto LAB_00188a0f;
  case L'\f':
  case L'\r':
    uVar4 = Rand_div(100);
    uVar5 = Rand_div(6);
    wVar9 = potential;
    art->to_a = (short)((long)potential / 0x5dc) + (short)uVar5 + art->to_a + 9;
    if ((int)uVar4 < 0x18) {
      if (L'ණ' < wVar9) break;
      pcVar10 = "telepathy";
      goto LAB_001881e4;
    }
    if (uVar4 < 0x23) {
      uVar4 = Rand_div(2);
      if ((uVar4 == 0) && (L'ᆓ' < potential)) {
        paVar8 = lookup_activation("RAND_CURE");
        art->activation = paVar8;
      }
      get_property(art,(object *)0x0,"protection from confusion",L'\0',false);
      uVar4 = Rand_div(5);
      wVar9 = uVar4 * 5 + L'#';
LAB_00188507:
      pcVar10 = "sound resistance";
    }
    else if (uVar4 < 0x2e) {
      uVar4 = Rand_div(3);
      if (uVar4 != 0) {
        pcVar10 = "RAND_DETECT_D_S_T";
        if (L'ລ' < potential) {
          pcVar10 = "RAND_DETECT_ALL";
        }
        paVar8 = lookup_activation(pcVar10);
        art->activation = paVar8;
      }
      get_property(art,(object *)0x0,"protection from blindness",L'\0',false);
      get_property(art,(object *)0x0,"see invisible",L'\0',false);
      uVar4 = Rand_div(2);
      if (uVar4 == 0) {
        get_property(art,(object *)0x0,"darkness",L'\0',false);
      }
      uVar4 = Rand_div(4);
      wVar9 = uVar4 + L'\x01';
      pcVar10 = "searching skill";
    }
    else {
      if (0x38 < uVar4) {
        if (uVar4 < 0x44) {
          if ((wVar9 < L'ৄ') || (uVar4 = Rand_div(3), uVar4 == 0)) {
            pcVar10 = "RAND_HEROISM";
          }
          else {
            pcVar10 = "RAND_FRIGHTEN_ALL";
          }
          paVar8 = lookup_activation(pcVar10);
          art->activation = paVar8;
          get_property(art,(object *)0x0,"protection from fear",L'\0',false);
          uVar4 = Rand_div(4);
          get_property(art,(object *)0x0,"strength",uVar4 + L'\x01',false);
          uVar4 = Rand_div(4);
          get_property(art,(object *)0x0,"dexterity",uVar4 + L'\x01',false);
          get_property(art,(object *)0x0,"sustain dexterity",L'\0',true);
          pcVar10 = "sustain strength";
          wVar9 = L'\0';
          goto LAB_00189825;
        }
        if (0x4e < uVar4) {
          if ((0x59 < uVar4) || (uVar4 = Rand_div(3), uVar4 == 0)) break;
          pcVar10 = "RAND_HEAL1";
          if (L'ৃ' < potential) {
            pcVar10 = "RAND_HEAL2";
          }
          pcVar11 = "RAND_HEAL3";
          if (potential < L'ྠ') {
            pcVar11 = pcVar10;
          }
          paVar8 = lookup_activation(pcVar11);
          art->activation = paVar8;
          pcVar10 = "regeneration";
          goto LAB_001881e4;
        }
        if (L'ৃ' < wVar9) break;
        pcVar10 = "RAND_IDENTIFY";
        goto LAB_00189908;
      }
      uVar4 = Rand_div(4);
      get_property(art,(object *)0x0,"wisdom",uVar4 + L'\x01',false);
      uVar4 = Rand_div(3);
      if (uVar4 != 0) break;
      uVar4 = Rand_div(2);
      wVar9 = uVar4 + L'\x03';
      pcVar10 = "extra armor";
    }
    goto LAB_00188a0f;
  case L'\x0e':
    uVar4 = Rand_div(100);
    uVar5 = Rand_div(8);
    wVar9 = potential;
    art->to_a = (short)(potential / 0x5dc) + (short)uVar5 + art->to_a + 9;
    if ((int)uVar4 < 0x12) {
      uVar4 = Rand_div(3);
      if (L'ஷ' < potential && uVar4 == 0) {
        pcVar10 = "RAND_RESIST_ELEMENTS";
        if (0x157b < (uint)potential) {
          pcVar10 = "RAND_RESIST_ALL";
        }
        paVar8 = lookup_activation(pcVar10);
        art->activation = paVar8;
      }
      uVar4 = Rand_div(5);
      if (uVar4 != 0) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"acid resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(5);
      if (uVar4 != 0) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"electricity resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(5);
      if (uVar4 != 0) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"fire resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(5);
      if (uVar4 == 0) break;
LAB_00189336:
      uVar4 = Rand_div(5);
      wVar9 = uVar4 * 5 + L'#';
      pcVar10 = "cold resistance";
LAB_0018934b:
      _Var12 = true;
    }
    else {
      if (uVar4 < 0x1e) {
        uVar4 = Rand_div(4);
        get_property(art,(object *)0x0,"constitution",uVar4 + L'\x01',false);
        uVar4 = Rand_div(4);
        wVar9 = uVar4 + L'\x01';
        pcVar10 = "strength";
        goto LAB_00188a0f;
      }
      if (0x2c < uVar4) {
        if (uVar4 < 0x37) {
          uVar4 = Rand_div(5);
          _Var12 = true;
          get_property(art,(object *)0x0,"light resistance",uVar4 * 5 + L'#',true);
          uVar4 = Rand_div(5);
          wVar9 = uVar4 * 5 + L'#';
          pcVar10 = "dark resistance";
          goto LAB_00189354;
        }
        if (uVar4 < 0x55) {
          uVar4 = Rand_div(3);
          if ((uVar4 == 0) && (L'ྟ' < potential)) {
            paVar8 = lookup_activation("RAND_SHIELD");
            art->activation = paVar8;
          }
          uVar4 = Rand_div(6);
          get_property(art,(object *)0x0,"armor bonus",uVar4 + potential / 2000 + L'\x01',true);
          uVar4 = Rand_div(4);
          if (uVar4 == 0) {
            get_property(art,(object *)0x0,"regeneration",L'\0',false);
          }
          uVar4 = Rand_div(4);
          if (uVar4 == 0) {
            get_property(art,(object *)0x0,"feather falling",L'\0',false);
          }
          uVar4 = Rand_div(4);
          if (uVar4 == 0) {
            get_property(art,(object *)0x0,"hold life",L'\0',false);
          }
          uVar4 = Rand_div(4);
          if (uVar4 == 0) {
            get_property(art,(object *)0x0,"see invisible",L'\0',false);
          }
          uVar4 = Rand_div(4);
          if (uVar4 == 0) {
            get_property(art,(object *)0x0,"free action",L'\0',false);
          }
          uVar4 = Rand_div(4);
          if (uVar4 == 0) {
            get_property(art,(object *)0x0,"protection from blindness",L'\0',false);
          }
          uVar4 = Rand_div(4);
          if (uVar4 == 0) {
            get_property(art,(object *)0x0,"protection from confusion",L'\0',false);
          }
          uVar4 = Rand_div(4);
          if (uVar4 != 0) break;
          pcVar10 = "protection from stunning";
          goto LAB_001881e4;
        }
        if (wVar9 < L'ᎈ' || 99 < uVar4) break;
        uVar4 = Rand_div(4);
        switch(uVar4) {
        case 0:
          pcVar10 = "fire resistance";
          break;
        case 1:
          pcVar10 = "cold resistance";
          break;
        case 2:
          pcVar10 = "acid resistance";
          break;
        case 3:
          pcVar10 = "electricity resistance";
          break;
        default:
          goto switchD_00189af1_default;
        }
        wVar9 = L'd';
        goto LAB_0018934b;
      }
      uVar4 = Rand_div(5);
      get_property(art,(object *)0x0,"shards resistance",uVar4 * 5 + L'#',true);
      uVar4 = Rand_div(3);
      wVar9 = uVar4 + potential / 0x4b0 + L'\x01';
      pcVar10 = "extra armor";
LAB_00189825:
      _Var12 = true;
    }
    goto LAB_00189354;
  case L'\x0f':
    uVar4 = Rand_div(100);
    uVar5 = Rand_div(6);
    art->to_a = (short)(potential / 0x5dc) + (short)uVar5 + art->to_a + 9;
    if ((int)uVar4 < 0x14) {
      uVar4 = Rand_div(2);
      if (uVar4 == 0) {
        paVar8 = lookup_activation("RAND_SLEEP_FOES");
        art->activation = paVar8;
      }
      uVar4 = Rand_div(4);
      pcVar10 = "stealth";
LAB_00188586:
      wVar9 = uVar4 + L'\x01';
LAB_0018858b:
      _Var12 = false;
LAB_0018858e:
      get_property(art,(object *)0x0,pcVar10,wVar9,_Var12);
    }
    else if (uVar4 < 0x1e) {
      uVar4 = Rand_div(2);
      if (uVar4 == 0) {
        uVar4 = Rand_div(2);
        if (uVar4 == 0) {
          pcVar10 = "RAND_CONFU_FOES";
        }
        else {
          pcVar10 = "RAND_TURN_FOES";
        }
LAB_00189b92:
        paVar8 = lookup_activation(pcVar10);
        art->activation = paVar8;
      }
    }
    else if (uVar4 < 0x28) {
      uVar4 = Rand_div(4);
      if ((uVar4 == 0) && (L'ஷ' < potential)) {
        paVar8 = lookup_activation("RAND_SHIELD");
        art->activation = paVar8;
      }
      uVar4 = Rand_div(3);
      get_property(art,(object *)0x0,"armor bonus",uVar4 + potential / 0x640 + L'\x01',true);
      uVar4 = Rand_div(3);
      get_property(art,(object *)0x0,"extra armor",uVar4 + potential / 0x640 + L'\x01',true);
      uVar4 = Rand_div(3);
      if (uVar4 == 0) {
        uVar4 = Rand_div(5);
        wVar9 = uVar4 + L'\x04';
        pcVar10 = "damage reduction";
        _Var12 = true;
        goto LAB_0018858e;
      }
    }
    else {
      if (uVar4 < 0x32) {
        uVar4 = Rand_div(2);
        if (uVar4 == 0) {
          pcVar10 = "RAND_DETECT_MONSTERS";
        }
        else {
          pcVar10 = "RAND_DETECT_EVIL";
        }
        goto LAB_00189b92;
      }
      if (uVar4 < 0x3c) {
        uVar4 = Rand_div(3);
        if (uVar4 != 0) {
          if ((potential < L'ྠ') || (uVar4 = Rand_div(3), uVar4 == 0)) {
            if (potential < L'ஸ') {
              pcVar10 = "RAND_DETECT_D_S_T";
            }
            else {
              pcVar10 = "RAND_MAGIC_MAP";
            }
          }
          else {
            pcVar10 = "RAND_DETECT_ALL";
          }
          paVar8 = lookup_activation(pcVar10);
          art->activation = paVar8;
        }
        uVar4 = Rand_div(4);
        pcVar10 = "searching skill";
        goto LAB_00188586;
      }
      if (uVar4 < 0x41) {
        uVar4 = Rand_div(3);
        uVar5 = Rand_div(2);
        if (uVar5 == 0) {
          paVar8 = lookup_activation("RAND_SLOW_FOES");
          art->activation = paVar8;
        }
        if (uVar4 < 3) {
          iVar13 = *(int *)(&DAT_0021cc7c + (ulong)uVar4 * 4);
          uVar4 = Rand_div(5);
          get_property(art,(object *)0x0,&DAT_0021cc7c + iVar13,uVar4 * 5 + L'#',false);
        }
        uVar4 = Rand_div(4);
        get_property(art,(object *)0x0,"infravision",uVar4 + L'\x01',false);
        uVar4 = Rand_div(6);
        if (uVar4 == 0) {
          uVar4 = Rand_div(2);
          wVar9 = ~uVar4;
          pcVar10 = "magic mastery";
          goto LAB_0018858b;
        }
      }
    }
    wVar9 = art->sval;
    wVar6 = lookup_sval(L'\x0f',"Elven Cloak");
    if (wVar9 == wVar6) {
      iVar13 = potential / 0x9c4;
      uVar4 = Rand_div(2);
      art->modifiers[5] = (short)uVar4 + (short)iVar13 + art->modifiers[5] + 1;
    }
    break;
  case L'\x10':
  case L'\x11':
  case L'\x12':
    uVar4 = Rand_div(100);
    uVar5 = Rand_div(8);
    wVar9 = potential;
    art->to_a = (short)(potential / 0x5dc) + (short)uVar5 + art->to_a + 0xb;
    if ((int)uVar4 < 0x1e) {
      uVar4 = Rand_div(2);
      if (L'ஷ' < potential && uVar4 == 0) {
        pcVar10 = "RAND_RESIST_ELEMENTS";
        if (0x157b < (uint)potential) {
          pcVar10 = "RAND_RESIST_ALL";
        }
        paVar8 = lookup_activation(pcVar10);
        art->activation = paVar8;
      }
      uVar4 = Rand_div(5);
      if (uVar4 != 0) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"acid resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(5);
      if (uVar4 != 0) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"electricity resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(5);
      if (uVar4 != 0) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"fire resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(5);
      if (uVar4 != 0) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"cold resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(2);
      if ((uVar4 != 0) || (potential < L'ߐ')) break;
      uVar4 = Rand_div(5);
      wVar9 = uVar4 * 5 + L'#';
LAB_00188182:
      pcVar10 = "poison resistance";
      goto LAB_00188a0f;
    }
    if (uVar4 < 0x28) {
      if (L'ᕻ' < wVar9) {
        uVar4 = Rand_div(3);
        if (uVar4 != 0) {
          uVar4 = Rand_div(2);
          pcVar10 = "RAND_REGAIN";
          if (uVar4 == 0) {
            pcVar10 = "RAND_HEAL3";
          }
          paVar8 = lookup_activation(pcVar10);
          art->activation = paVar8;
        }
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"nether resistance",uVar4 * 5 + L'#',false);
        get_property(art,(object *)0x0,"hold life",L'\0',false);
        uVar4 = Rand_div(2);
        if (uVar4 == 0) {
          uVar4 = Rand_div(5);
          pcVar10 = "chaos resistance";
          _Var12 = false;
LAB_00189294:
          get_property(art,(object *)0x0,pcVar10,uVar4 * 5 + L'#',_Var12);
        }
      }
LAB_0018929c:
      uVar4 = Rand_div(5);
      if ((int)uVar4 < 2) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"acid resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(5);
      if ((int)uVar4 < 2) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"electricity resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(5);
      if ((int)uVar4 < 2) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"fire resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(5);
      if (1 < (int)uVar4) break;
      goto LAB_00189336;
    }
    if (uVar4 < 0x32) {
      uVar4 = Rand_div(5);
      get_property(art,(object *)0x0,"sound resistance",uVar4 * 5 + L'#',false);
      get_property(art,(object *)0x0,"protection from confusion",L'\0',false);
      goto LAB_0018929c;
    }
    if (uVar4 < 0x3e) {
      uVar4 = Rand_div(3);
      if ((uVar4 == 0) && (L'ྟ' < potential)) {
        paVar8 = lookup_activation("RAND_SHIELD");
        art->activation = paVar8;
      }
      uVar4 = Rand_div(3);
      get_property(art,(object *)0x0,"armor bonus",uVar4 + potential / 0x640 + L'\x01',true);
      uVar4 = Rand_div(3);
      get_property(art,(object *)0x0,"extra armor",uVar4 + potential / 0x640 + L'\x01',true);
      uVar4 = Rand_div(3);
      if (uVar4 != 0) {
        uVar4 = Rand_div(10);
        get_property(art,(object *)0x0,"damage reduction",uVar4 + L'\x06',true);
      }
      uVar4 = Rand_div(5);
      if ((int)uVar4 < 2) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"acid resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(5);
      if ((int)uVar4 < 2) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"electricity resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(5);
      if ((int)uVar4 < 2) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"fire resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(5);
      if ((int)uVar4 < 2) {
        uVar4 = Rand_div(5);
        get_property(art,(object *)0x0,"cold resistance",uVar4 * 5 + L'#',true);
      }
      uVar4 = Rand_div(6);
      if (uVar4 == 0) {
        wVar9 = lookup_curse("impair hitpoint recovery");
        uVar4 = Rand_div(0x14);
        append_artifact_curse(art,wVar9,uVar4 + L'(');
        potential = potential + L'd';
      }
      break;
    }
    if (uVar4 < 0x4a) {
      uVar4 = Rand_div(3);
      if (uVar4 != 0) {
        uVar4 = Rand_div(2);
        pcVar10 = "RAND_BLESS";
        if (uVar4 == 0) {
          pcVar10 = "RAND_TELEPORT1";
        }
        paVar8 = lookup_activation(pcVar10);
        art->activation = paVar8;
      }
      uVar4 = Rand_div(5);
      get_property(art,(object *)0x0,"dark resistance",uVar4 * 5 + L'#',true);
      uVar4 = Rand_div(4);
      get_property(art,(object *)0x0,"stealth",uVar4 + L'\x01',true);
      get_property(art,(object *)0x0,"see invisible",L'\0',true);
      uVar4 = Rand_div(5);
      if ((int)uVar4 < 2) {
        uVar4 = Rand_div(5);
        pcVar10 = "nether resistance";
LAB_0018928b:
        _Var12 = true;
        goto LAB_00189294;
      }
      goto LAB_0018929c;
    }
    if (uVar4 < 0x52) {
      if (L'ৃ' < wVar9) {
        uVar4 = Rand_div(3);
        if (uVar4 != 0) {
          paVar8 = lookup_activation("RAND_CURE");
          art->activation = paVar8;
        }
        uVar4 = Rand_div(5);
        pcVar10 = "poison resistance";
        goto LAB_0018928b;
      }
      goto LAB_0018929c;
    }
    if (uVar4 < 0x5f) {
      uVar4 = Rand_div(3);
      if (uVar4 != 0) {
        pcVar10 = "RAND_LIGHT2";
        if (potential < L'ᆔ') {
          pcVar10 = "RAND_LIGHT1";
        }
        paVar8 = lookup_activation(pcVar10);
        art->activation = paVar8;
      }
      get_property(art,(object *)0x0,"light",L'\x01',true);
      uVar4 = Rand_div(5);
      get_property(art,(object *)0x0,"light resistance",uVar4 * 5 + L'#',true);
      goto LAB_0018929c;
    }
    if (99 < uVar4) break;
    if (wVar9 < L'ᕼ') goto switchD_00189b35_default;
    uVar4 = Rand_div(4);
    switch(uVar4) {
    case 0:
      uVar4 = Rand_div(3);
      if (uVar4 != 0) {
        paVar8 = lookup_activation("RAND_FIRE3");
        art->activation = paVar8;
      }
      get_property(art,(object *)0x0,"fire resistance",L'd',true);
      uVar4 = Rand_div(4);
      if (uVar4 == 0) {
        pcVar10 = "demon summon";
LAB_00189cf8:
        wVar9 = lookup_curse(pcVar10);
        uVar4 = Rand_div(0x14);
        append_artifact_curse(art,wVar9,uVar4 + L'(');
        potential = potential + L'd';
      }
      break;
    case 1:
      uVar4 = Rand_div(3);
      if (uVar4 != 0) {
        paVar8 = lookup_activation("RAND_COLD3");
        art->activation = paVar8;
      }
      get_property(art,(object *)0x0,"cold resistance",L'd',true);
      uVar4 = Rand_div(4);
      if (uVar4 == 0) {
        pcVar10 = "undead summon";
        goto LAB_00189cf8;
      }
      break;
    case 2:
      uVar4 = Rand_div(3);
      if (uVar4 != 0) {
        paVar8 = lookup_activation("RAND_ACID3");
        art->activation = paVar8;
      }
      pcVar10 = "acid resistance";
      goto LAB_00189c9a;
    case 3:
      uVar4 = Rand_div(3);
      if (uVar4 != 0) {
        paVar8 = lookup_activation("RAND_ELEC3");
        art->activation = paVar8;
      }
      pcVar10 = "electricity resistance";
LAB_00189c9a:
      get_property(art,(object *)0x0,pcVar10,L'd',true);
    }
switchD_00189b35_default:
    uVar4 = Rand_div(5);
    if ((int)uVar4 < 2) {
      uVar4 = Rand_div(5);
      get_property(art,(object *)0x0,"acid resistance",uVar4 * 5 + L'#',true);
    }
    uVar4 = Rand_div(5);
    if ((int)uVar4 < 2) {
      uVar4 = Rand_div(5);
      get_property(art,(object *)0x0,"electricity resistance",uVar4 * 5 + L'#',true);
    }
    uVar4 = Rand_div(5);
    if ((int)uVar4 < 2) {
      uVar4 = Rand_div(5);
      get_property(art,(object *)0x0,"fire resistance",uVar4 * 5 + L'#',true);
    }
    uVar4 = Rand_div(5);
    if ((int)uVar4 < 2) {
      uVar4 = Rand_div(5);
      get_property(art,(object *)0x0,"cold resistance",uVar4 * 5 + L'#',true);
    }
    if (art->tval != L'\x12') break;
    iVar13 = potential / 0x9c4;
    uVar4 = Rand_div(2);
    wVar9 = uVar4 + iVar13 + L'\x01';
    pcVar10 = "speed";
LAB_00188a0f:
    _Var12 = false;
LAB_00189354:
    get_property(art,(object *)0x0,pcVar10,wVar9,_Var12);
  }
switchD_00189af1_default:
  uVar4 = Rand_div(6);
  if (uVar4 == 0) {
    wVar9 = art->weight;
    uVar4 = Rand_div(2);
    wVar6 = art->weight;
    if (uVar4 == 0) {
      if (L'\x1d' < wVar6) {
        uVar4 = Rand_div((uint)wVar6 / 10);
        wVar6 = uVar4 * 5 + art->weight + L'\n';
        art->weight = wVar6;
        potential = (wVar6 - wVar9) * 10 + potential;
      }
    }
    else if (L'1' < wVar6) {
      uVar4 = Rand_div((uint)wVar6 / 10);
      wVar6 = uVar4 * -5 + art->weight + L'\xfffffff6';
      art->weight = wVar6;
      potential = (wVar9 - wVar6) * -10 + potential;
      if (potential < L'\x01') {
        potential = L'\0';
      }
    }
  }
  return;
}

Assistant:

static void choose_artifact_theme(struct artifact *art)
{
	struct object_kind *kind = lookup_kind(art->tval, art->sval);

	/* Possibly make very powerful artifacts cursed. */
	if ((potential > 6000) && (potential > randint1(30000))) {
		int max_tries;
		for (max_tries = 3; max_tries; max_tries--) {
			int pick = randint1(z_info->curse_max - 1);
			int power = randint1(9) + 10 * m_bonus(9, art->alloc_min);
			if (!curses[pick].poss[art->tval]) continue;
			append_artifact_curse(art, pick, power);
		}
	}

	/* Frequently (but not always) assign a basic theme to the artifact. */
	switch (kind->tval) {
		case TV_SWORD:
		case TV_POLEARM:
		case TV_HAFTED: choose_melee_weapon_theme(art); break;
		case TV_BOW: choose_launcher_theme(art); break;
		case TV_SOFT_ARMOR:
		case TV_HARD_ARMOR:
		case TV_DRAG_ARMOR: choose_armor_theme(art); break;
		case TV_SHIELD: choose_shield_theme(art); break;
		case TV_BOOTS: choose_boots_theme(art); break;
		case TV_CLOAK: choose_cloak_theme(art); break;
		case TV_HELM:
		case TV_CROWN: choose_hat_theme(art); break;
		case TV_GLOVES: choose_gloves_theme(art); break;
		default: msg("error -- object kind not recognized."); break;
	}

	/* It is possible for artifacts to be unusually heavy or light. */
	if (one_in_(6)) {
		int old_weight = art->weight;
		if (one_in_(2) && (art->weight >= 30)) {
			/* Sometimes, they are unusually heavy. */
			art->weight += randint1(art->weight / 10) * 5 + 5;
			potential += (art->weight - old_weight) * 10;
		} else if (art->weight >= 50) {
			/* Sometimes, they are unusually light. */
			art->weight -= randint1(art->weight / 10) * 5 + 5;
			potential -= (old_weight - art->weight) * 10;
			potential = MAX(potential, 0);
		}
	}
}